

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::VisibilityGroup::appendVariableMaxFraction
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  Distance *integer;
  char cVar1;
  optional<std::pair<unsigned_int,_unsigned_int>_> oVar2;
  optional<metaf::Distance> t;
  Distance local_44;
  _Storage<metaf::Distance,_true> local_34;
  char local_24;
  
  oVar2 = fractionStrToUint(group,0,group->_M_string_length);
  cVar1 = '\0';
  if (((undefined1  [12])
       oVar2.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
       super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> & (undefined1  [12])0x1)
      != (undefined1  [12])0x0) {
    local_44.distModifier = NONE;
    if ((ulong)oVar2.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
               _M_payload.super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
               _M_payload >> 0x20 == 0) {
      cVar1 = '\0';
    }
    else {
      local_44.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           ((ulong)(uint)(oVar2.
                          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
                          _M_payload.
                          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
                          _M_payload._0_4_ * 10000) /
            ((ulong)oVar2.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
                    _M_payload.super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
                    _M_payload >> 0x20) | 0x100000000);
      local_44.distUnit = STATUTE_MILES;
      integer = &this->visMax;
      Distance::fromIntegerAndFraction
                ((optional<metaf::Distance> *)&local_34._M_value,integer,&local_44);
      cVar1 = local_24;
      if (local_24 == '\x01') {
        integer->distModifier = local_34._0_4_;
        (integer->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             local_34._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        *(undefined8 *)
         &(this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = local_34._8_8_;
        this->incompleteText = next;
      }
    }
  }
  return (bool)cVar1;
}

Assistant:

bool VisibilityGroup::appendVariableMaxFraction(const std::string & group, IncompleteText next) {
	const auto fraction = fractionStrToUint(group, 0, group.length());
	if (!fraction.has_value()) return false;
	const auto numerator = std::get<0>(*fraction);
	const auto denominator = std::get<1>(*fraction);
	const auto v = Distance(numerator, denominator);
	if (!v.isValue()) return false;
	const auto t = Distance::fromIntegerAndFraction(visMax, v);
	if (!t.has_value()) return false;
	visMax = *t;
	incompleteText = next;
	return true;
}